

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_integer64i_v(NegativeTestContext *ctx)

{
  GLint64 GVar1;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  GLuint local_20;
  GLuint local_1c;
  GLint maxShaderStorageBufferBindings;
  GLint maxUniformBufferBindings;
  GLint64 data;
  NegativeTestContext *ctx_local;
  
  _maxShaderStorageBufferBindings = -1;
  local_1c = 0;
  local_20 = 0;
  data = (GLint64)ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"GL_INVALID_ENUM is generated if name is not an accepted value.",
             &local_41);
  NegativeTestContext::beginSection(ctx,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glGetInteger64i_v
            ((CallLogWrapper *)data,0xffffffff,0,(GLint64 *)&maxShaderStorageBufferBindings);
  NegativeTestContext::expectError((NegativeTestContext *)data,0x500);
  NegativeTestContext::endSection((NegativeTestContext *)data);
  GVar1 = data;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "GL_INVALID_VALUE is generated if index is outside of the valid range for the indexed state target."
             ,&local_79);
  NegativeTestContext::beginSection((NegativeTestContext *)GVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  glu::CallLogWrapper::glGetIntegerv((CallLogWrapper *)data,0x8a2f,(GLint *)&local_1c);
  NegativeTestContext::expectError((NegativeTestContext *)data,0);
  glu::CallLogWrapper::glGetInteger64i_v
            ((CallLogWrapper *)data,0x8a29,local_1c,(GLint64 *)&maxShaderStorageBufferBindings);
  NegativeTestContext::expectError((NegativeTestContext *)data,0x501);
  NegativeTestContext::endSection((NegativeTestContext *)data);
  GVar1 = data;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,
             "GL_INVALID_VALUE is generated if index is outside of the valid range for the indexed state target."
             ,&local_a1);
  NegativeTestContext::beginSection((NegativeTestContext *)GVar1,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  glu::CallLogWrapper::glGetIntegerv((CallLogWrapper *)data,0x90dd,(GLint *)&local_20);
  NegativeTestContext::expectError((NegativeTestContext *)data,0);
  glu::CallLogWrapper::glGetInteger64i_v
            ((CallLogWrapper *)data,0x90d4,local_20,(GLint64 *)&maxShaderStorageBufferBindings);
  NegativeTestContext::expectError((NegativeTestContext *)data,0x501);
  glu::CallLogWrapper::glGetInteger64i_v
            ((CallLogWrapper *)data,0x90d5,local_20,(GLint64 *)&maxShaderStorageBufferBindings);
  NegativeTestContext::expectError((NegativeTestContext *)data,0x501);
  NegativeTestContext::endSection((NegativeTestContext *)data);
  return;
}

Assistant:

void get_integer64i_v (NegativeTestContext& ctx)
{
	GLint64	data							= (GLint64)-1;
	GLint	maxUniformBufferBindings		= 0;
	GLint	maxShaderStorageBufferBindings	= 0;

	ctx.beginSection("GL_INVALID_ENUM is generated if name is not an accepted value.");
	ctx.glGetInteger64i_v(-1, 0, &data);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if index is outside of the valid range for the indexed state target.");
	ctx.glGetIntegerv(GL_MAX_UNIFORM_BUFFER_BINDINGS, &maxUniformBufferBindings);
	ctx.expectError(GL_NO_ERROR);
	ctx.glGetInteger64i_v(GL_UNIFORM_BUFFER_START, maxUniformBufferBindings, &data);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if index is outside of the valid range for the indexed state target.");
	ctx.glGetIntegerv(GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS, &maxShaderStorageBufferBindings);
	ctx.expectError(GL_NO_ERROR);
	ctx.glGetInteger64i_v(GL_SHADER_STORAGE_BUFFER_START, maxShaderStorageBufferBindings, &data);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glGetInteger64i_v(GL_SHADER_STORAGE_BUFFER_SIZE, maxShaderStorageBufferBindings, &data);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}